

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void muxBlankPL(string *appDir,BlurayHelper *blurayHelper,PIDListMap *pidList,DiskType dt,
               int blankNum)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer *ppdVar4;
  string *psVar5;
  double dVar6;
  bool bVar7;
  bool bVar8;
  BlurayHelper *this;
  uint uVar9;
  int iVar10;
  long *plVar11;
  _Base_ptr p_Var12;
  long lVar13;
  undefined8 *puVar14;
  ssize_t sVar15;
  mapped_type *pmVar16;
  TSMuxer *mainMuxer;
  undefined4 *puVar17;
  _func_int **pp_Var18;
  ulong uVar19;
  size_t __n;
  uint8_t *puVar20;
  uint uVar21;
  _Rb_tree_header *p_Var22;
  int __fd;
  _Alloc_hider _Var23;
  undefined8 uVar24;
  pointer pdVar25;
  void *__buf;
  ulong __val;
  int iVar26;
  uint8_t *puVar27;
  string __str;
  string tmpFileName;
  vector<double,_std::allocator<double>_> local_408;
  File file;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  videoParams;
  uint *local_380;
  undefined8 local_378;
  uint local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  uint *local_360;
  undefined8 local_358;
  uint local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  BlurayHelper *local_340;
  ulong local_338;
  uint8_t *local_330;
  string *local_328;
  ostringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310 [46];
  
  local_338 = (ulong)(uint)blankNum;
  p_Var12 = (pidList->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var22 = &(pidList->_M_t)._M_impl.super__Rb_tree_header;
  __buf = (void *)0x284;
  puVar27 = pattern_1920;
  local_340 = blurayHelper;
  local_328 = appDir;
  if ((_Rb_tree_header *)p_Var12 != p_Var22) {
    do {
      if ((p_Var12[6]._M_right != (_Base_ptr)0x0) &&
         (plVar11 = (long *)__dynamic_cast(p_Var12[6]._M_right,&AbstractStreamReader::typeinfo,
                                           &MPEGStreamReader::typeinfo,0), plVar11 != (long *)0x0))
      {
        uVar21 = (**(code **)(*plVar11 + 0xa0))(plVar11);
        uVar9 = (**(code **)(*plVar11 + 0xa8))(plVar11);
        dVar6 = (double)plVar11[0x11];
        if ((0x1e0 < uVar9 || 0x356 < uVar21) || (ABS(25.0 - dVar6) < 0.5)) {
          bVar7 = false;
        }
        else {
          bVar7 = 0.5 <= ABS(50.0 - dVar6);
        }
        bVar8 = uVar9 < 0x241 && uVar21 < 0x401;
        if ((uVar9 < 0x241 && uVar21 < 0x401) && (0.5 <= ABS(25.0 - dVar6))) {
          bVar8 = ABS(50.0 - dVar6) < 0.5;
        }
        if (bVar7) {
          __buf = (void *)0xba;
          puVar27 = pattern_ntsc;
        }
        else {
          puVar20 = pattern_1280;
          if (0x513 < uVar21) {
            puVar20 = pattern_1920;
          }
          uVar9 = 0x151;
          if (0x513 < uVar21) {
            uVar9 = 0x284;
          }
          puVar27 = pattern_pal;
          if (!bVar8 && !bVar7) {
            puVar27 = puVar20;
          }
          __buf = (void *)0xcc;
          if (!bVar8 && !bVar7) {
            __buf = (void *)(ulong)uVar9;
          }
        }
        goto LAB_00195a8f;
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var22);
    puVar27 = pattern_1920;
  }
LAB_00195a8f:
  lVar13 = std::chrono::_V2::system_clock::now();
  videoParams._M_t._M_impl._0_8_ =
       &videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&videoParams,"blank_","");
  local_330 = puVar27;
  plVar11 = (long *)std::__cxx11::string::replace
                              ((ulong)&videoParams,0,(char *)0x0,
                               (ulong)(local_328->_M_dataplus)._M_p);
  uVar19 = lVar13 / 1000;
  psVar5 = &file.m_name;
  pp_Var18 = (_func_int **)(plVar11 + 2);
  if ((_func_int **)*plVar11 == pp_Var18) {
    file.m_name._M_dataplus._M_p = (pointer)*pp_Var18;
    file.m_name._M_string_length = plVar11[3];
    file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream =
         (AbstractStream)(AbstractStream)psVar5;
  }
  else {
    file.m_name._M_dataplus._M_p = (pointer)*pp_Var18;
    file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream =
         (AbstractStream)(AbstractStream)*plVar11;
  }
  file.m_impl = (void *)plVar11[1];
  *plVar11 = (long)pp_Var18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  __val = -uVar19;
  if (0 < (long)uVar19) {
    __val = uVar19;
  }
  uVar21 = 1;
  if (9 < __val) {
    uVar19 = __val;
    uVar9 = 4;
    do {
      uVar21 = uVar9;
      if (uVar19 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00195bb4;
      }
      if (uVar19 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00195bb4;
      }
      if (uVar19 < 10000) goto LAB_00195bb4;
      bVar7 = 99999 < uVar19;
      uVar19 = uVar19 / 10000;
      uVar9 = uVar21 + 4;
    } while (bVar7);
    uVar21 = uVar21 + 1;
  }
LAB_00195bb4:
  paVar3 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&__str,(lVar13 < -999) + (char)uVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p + (lVar13 < -999),uVar21,__val);
  _Var23._M_p = (pointer)0xf;
  if (file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream !=
      (AbstractStream)psVar5) {
    _Var23 = file.m_name._M_dataplus;
  }
  if (_Var23._M_p < (pointer)(__str._M_string_length + (long)file.m_impl)) {
    uVar24 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar3) {
      uVar24 = __str.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar24 < (pointer)(__str._M_string_length + (long)file.m_impl)) goto LAB_00195c3a;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&__str,0,(char *)0x0,
                         (ulong)file.super_AbstractOutputStream.super_AbstractStream.
                                _vptr_AbstractStream);
  }
  else {
LAB_00195c3a:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&file,(ulong)__str._M_dataplus._M_p);
  }
  _ss = (pointer)local_310;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar14 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 == paVar1) {
    local_310[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_310[0]._8_4_ = *(undefined4 *)(puVar14 + 3);
    local_310[0]._12_4_ = *(undefined4 *)((long)puVar14 + 0x1c);
  }
  else {
    local_310[0]._0_8_ = paVar1->_M_allocated_capacity;
    _ss = (pointer)*puVar14;
  }
  lVar13 = puVar14[1];
  *puVar14 = paVar1;
  puVar14[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  ppdVar4 = &local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppdVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,".264","");
  uVar24 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_310) {
    uVar24 = local_310[0]._M_allocated_capacity;
  }
  if ((ulong)uVar24 <
      (pointer)((long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar13)) {
    pdVar25 = (pointer)0xf;
    if ((pointer *)
        local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != ppdVar4) {
      pdVar25 = local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if ((pointer)((long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + lVar13) <= pdVar25) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_408,0,(char *)0x0,(ulong)_ss);
      goto LAB_00195d2e;
    }
  }
  puVar14 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&ss,
                       (ulong)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
LAB_00195d2e:
  tmpFileName._M_dataplus._M_p = (pointer)&tmpFileName.field_2;
  psVar2 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar2) {
    tmpFileName.field_2._M_allocated_capacity = *psVar2;
    tmpFileName.field_2._8_8_ = puVar14[3];
  }
  else {
    tmpFileName.field_2._M_allocated_capacity = *psVar2;
    tmpFileName._M_dataplus._M_p = (pointer)*puVar14;
  }
  tmpFileName._M_string_length = puVar14[1];
  *puVar14 = psVar2;
  puVar14[1] = 0;
  *(char *)psVar2 = '\0';
  if ((pointer *)
      local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != ppdVar4) {
    operator_delete(local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_310) {
    operator_delete(_ss,local_310[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar3) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  if (file.super_AbstractOutputStream.super_AbstractStream._vptr_AbstractStream !=
      (AbstractStream)psVar5) {
    operator_delete((void *)file.super_AbstractOutputStream.super_AbstractStream.
                            _vptr_AbstractStream,(ulong)(file.m_name._M_dataplus._M_p + 1));
  }
  iVar26 = (int)local_330;
  if ((_Base_ptr *)videoParams._M_t._M_impl._0_8_ !=
      &videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)videoParams._M_t._M_impl._0_8_,
                    (ulong)((long)&(videoParams._M_t._M_impl.super__Rb_tree_header._M_header.
                                   _M_parent)->_M_color + 1));
  }
  File::File(&file);
  __n = 0;
  iVar10 = File::open(&file,tmpFileName._M_dataplus._M_p,2);
  if ((char)iVar10 == '\0') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&ss,"can\'t create file ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&ss,tmpFileName._M_dataplus._M_p,tmpFileName._M_string_length);
    puVar17 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar17 = 3;
    *(undefined4 **)(puVar17 + 2) = puVar17 + 6;
    if (local_360 == &local_350) {
      puVar17[6] = local_350;
      puVar17[7] = uStack_34c;
      puVar17[8] = uStack_348;
      puVar17[9] = uStack_344;
    }
    else {
      *(uint **)(puVar17 + 2) = local_360;
      *(ulong *)(puVar17 + 6) = CONCAT44(uStack_34c,local_350);
    }
    *(undefined8 *)(puVar17 + 4) = local_358;
    local_358 = 0;
    local_350 = local_350 & 0xffffff00;
    local_360 = &local_350;
    __cxa_throw(puVar17,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar10 = 3;
  do {
    __fd = iVar26;
    sVar15 = File::write(&file,iVar26,__buf,__n);
    if ((int)sVar15 != (int)__buf) {
      deleteFile(&tmpFileName);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ss,"can\'t write data to file ",0x19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&ss,tmpFileName._M_dataplus._M_p,tmpFileName._M_string_length);
      puVar17 = (undefined4 *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      *puVar17 = 3;
      *(undefined4 **)(puVar17 + 2) = puVar17 + 6;
      if (local_380 == &local_370) {
        puVar17[6] = local_370;
        puVar17[7] = uStack_36c;
        puVar17[8] = uStack_368;
        puVar17[9] = uStack_364;
      }
      else {
        *(uint **)(puVar17 + 2) = local_380;
        *(ulong *)(puVar17 + 6) = CONCAT44(uStack_36c,local_370);
      }
      *(undefined8 *)(puVar17 + 4) = local_378;
      local_370 = local_370 & 0xffffff00;
      __cxa_throw(puVar17,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  File::close(&file,__fd);
  videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &videoParams._M_t._M_impl.super__Rb_tree_header._M_header;
  videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  videoParams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       videoParams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  _ss = (pointer)local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"insertSEI","");
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](&videoParams,(key_type *)&ss);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_310) {
    operator_delete(_ss,local_310[0]._M_allocated_capacity + 1);
  }
  _ss = (pointer)local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ss,"fps","");
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&videoParams,(key_type *)&ss);
  std::__cxx11::string::_M_replace((ulong)pmVar16,0,(char *)pmVar16->_M_string_length,0x206c8e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_310) {
    operator_delete(_ss,local_310[0]._M_allocated_capacity + 1);
  }
  MuxerManager::MuxerManager
            ((MuxerManager *)&ss,&readManager,&tsMuxerFactory.super_AbstractMuxerFactory);
  uVar19 = local_338;
  this = local_340;
  __str._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&__str,"MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500","");
  MuxerManager::parseMuxOpt((MuxerManager *)&ss,&__str);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar3) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  __str._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"V_MPEG4/ISO/AVC","");
  MuxerManager::addStream((MuxerManager *)&ss,&__str,&tmpFileName,&videoParams);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar3) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  iVar26 = (int)uVar19;
  BlurayHelper::m2tsFileName_abi_cxx11_(&__str,this,iVar26);
  MuxerManager::doMux((MuxerManager *)&ss,&__str,&this->super_FileFactory);
  mainMuxer = (TSMuxer *)MuxerManager::getMainMuxer((MuxerManager *)&ss);
  if ((mainMuxer == (TSMuxer *)0x0) ||
     ((mainMuxer->super_AbstractMuxer)._vptr_AbstractMuxer != (_func_int **)&PTR__TSMuxer_0023f678))
  {
    mainMuxer = (TSMuxer *)0x0;
  }
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BlurayHelper::createMPLSFile(this,mainMuxer,(TSMuxer *)0x0,0,&local_408,dt,iVar26,false);
  if (local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_408.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BlurayHelper::createCLPIFile(this,mainMuxer,iVar26,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar3) {
    operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
  }
  MuxerManager::~MuxerManager((MuxerManager *)&ss);
  deleteFile(&tmpFileName);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&videoParams._M_t);
  File::~File(&file);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tmpFileName._M_dataplus._M_p != &tmpFileName.field_2) {
    operator_delete(tmpFileName._M_dataplus._M_p,tmpFileName.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void muxBlankPL(const string& appDir, BlurayHelper& blurayHelper, const PIDListMap& pidList, DiskType dt, int blankNum)
{
    unsigned videoWidth = 1920;
    unsigned videoHeight = 1080;
    double fps = 23.976;
    for (const auto& [pid, si] : pidList)
    {
        const PMTStreamInfo& streamInfo = si;
        const auto streamReader = dynamic_cast<const MPEGStreamReader*>(streamInfo.m_codecReader);
        if (streamReader)
        {
            videoWidth = streamReader->getStreamWidth();
            videoHeight = streamReader->getStreamHeight();
            fps = streamReader->getFPS();
            break;
        }
    }
    uint8_t* pattern;
    int patternSize;
    bool isNtsc = videoWidth <= 854 && videoHeight <= 480 && (fabs(25 - fps) >= 0.5 && fabs(50 - fps) >= 0.5);
    bool isPal = videoWidth <= 1024 && videoHeight <= 576 && (fabs(25 - fps) < 0.5 || fabs(50 - fps) < 0.5);
    if (isNtsc)
    {
        pattern = pattern_ntsc;
        patternSize = sizeof(pattern_ntsc);
    }
    else if (isPal)
    {
        pattern = pattern_pal;
        patternSize = sizeof(pattern_pal);
    }
    else if (videoWidth >= 1300)
    {
        pattern = pattern_1920;
        patternSize = sizeof(pattern_1920);
    }
    else
    {
        pattern = pattern_1280;
        patternSize = sizeof(pattern_1280);
    }
    auto fname_time = std::chrono::duration_cast<std::chrono::microseconds>(
                          std::chrono::high_resolution_clock::now().time_since_epoch())
                          .count();
    string tmpFileName = appDir + string("blank_") + std::to_string(fname_time) + string(".264");
    File file;
    if (!file.open(tmpFileName.c_str(), File::ofWrite))
        THROW(ERR_COMMON, "can't create file " << tmpFileName)
    for (int i = 0; i < 3; ++i)
    {
        if (file.write(pattern, patternSize) != patternSize)
        {
            deleteFile(tmpFileName);
            THROW(ERR_COMMON, "can't write data to file " << tmpFileName)
        }
    }
    file.close();
    map<string, string> videoParams;
    videoParams["insertSEI"];
    videoParams["fps"] = "23.976";
    {
        MuxerManager muxerManager(readManager, tsMuxerFactory);
        muxerManager.parseMuxOpt("MUXOPT --no-pcr-on-video-pid --vbr --avchd --vbv-len=500");
        muxerManager.addStream("V_MPEG4/ISO/AVC", tmpFileName, videoParams);
        string dstFile = blurayHelper.m2tsFileName(blankNum);
        muxerManager.doMux(dstFile, &blurayHelper);

        auto tsMuxer = dynamic_cast<TSMuxer*>(muxerManager.getMainMuxer());

        blurayHelper.createMPLSFile(tsMuxer, nullptr, 0, vector<double>(), dt, blankNum, false);
        blurayHelper.createCLPIFile(tsMuxer, blankNum, true);
    }
    deleteFile(tmpFileName);
}